

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O0

lzma_ret block_decode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                     size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  size_t sVar1;
  size_t sVar2;
  _Bool _Var3;
  lzma_bool lVar4;
  lzma_ret lVar5;
  uint32_t uVar6;
  int iVar7;
  lzma_vli add;
  ulong out_size_00;
  size_t check_size;
  size_t out_used;
  size_t in_used;
  lzma_ret ret;
  size_t out_start;
  size_t in_start;
  lzma_block_coder *coder;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  void *coder_ptr_local;
  
  iVar7 = *coder_ptr;
  if (iVar7 == 0) {
    sVar2 = *in_pos;
    sVar1 = *out_pos;
    lVar5 = (**(code **)((long)coder_ptr + 0x20))
                      (*(undefined8 *)((long)coder_ptr + 8),allocator,in,in_pos,in_size,out,out_pos,
                       out_size,action);
    add = *out_pos - sVar1;
    _Var3 = update_size((lzma_vli *)((long)coder_ptr + 0x58),*in_pos - sVar2,
                        *(lzma_vli *)((long)coder_ptr + 0x68));
    if ((_Var3) ||
       (_Var3 = update_size((lzma_vli *)((long)coder_ptr + 0x60),add,
                            *(lzma_vli *)(*(long *)((long)coder_ptr + 0x50) + 0x18)), _Var3)) {
      return LZMA_DATA_ERROR;
    }
    if ((*(byte *)((long)coder_ptr + 0xe0) & 1) == 0) {
      lzma_check_update((lzma_check_state *)((long)coder_ptr + 0x78),
                        *(lzma_check *)(*(long *)((long)coder_ptr + 0x50) + 8),out + sVar1,add);
    }
    if (lVar5 != LZMA_STREAM_END) {
      return lVar5;
    }
    _Var3 = is_size_valid(*(lzma_vli *)((long)coder_ptr + 0x58),
                          *(lzma_vli *)(*(long *)((long)coder_ptr + 0x50) + 0x10));
    if ((!_Var3) ||
       (_Var3 = is_size_valid(*(lzma_vli *)((long)coder_ptr + 0x60),
                              *(lzma_vli *)(*(long *)((long)coder_ptr + 0x50) + 0x18)), !_Var3)) {
      return LZMA_DATA_ERROR;
    }
    *(undefined8 *)(*(long *)((long)coder_ptr + 0x50) + 0x10) =
         *(undefined8 *)((long)coder_ptr + 0x58);
    *(undefined8 *)(*(long *)((long)coder_ptr + 0x50) + 0x18) =
         *(undefined8 *)((long)coder_ptr + 0x60);
    *(undefined4 *)coder_ptr = 1;
  }
  else if (iVar7 != 1) {
    if (iVar7 != 2) {
      return LZMA_PROG_ERROR;
    }
    goto LAB_00e55596;
  }
  while ((*(ulong *)((long)coder_ptr + 0x58) & 3) != 0) {
    if (in_size <= *in_pos) {
      return LZMA_OK;
    }
    *(long *)((long)coder_ptr + 0x58) = *(long *)((long)coder_ptr + 0x58) + 1;
    sVar2 = *in_pos;
    *in_pos = sVar2 + 1;
    if (in[sVar2] != '\0') {
      return LZMA_DATA_ERROR;
    }
  }
  if (*(int *)(*(long *)((long)coder_ptr + 0x50) + 8) == 0) {
    return LZMA_STREAM_END;
  }
  if ((*(byte *)((long)coder_ptr + 0xe0) & 1) == 0) {
    lzma_check_finish((lzma_check_state *)((long)coder_ptr + 0x78),
                      *(lzma_check *)(*(long *)((long)coder_ptr + 0x50) + 8));
  }
  *(undefined4 *)coder_ptr = 2;
LAB_00e55596:
  uVar6 = lzma_check_size(*(lzma_check *)(*(long *)((long)coder_ptr + 0x50) + 8));
  out_size_00 = (ulong)uVar6;
  lzma_bufcpy(in,in_pos,in_size,(uint8_t *)(*(long *)((long)coder_ptr + 0x50) + 0x28),
              (size_t *)((long)coder_ptr + 0x70),out_size_00);
  if (*(ulong *)((long)coder_ptr + 0x70) < out_size_00) {
    return LZMA_OK;
  }
  if ((((*(byte *)((long)coder_ptr + 0xe0) & 1) == 0) &&
      (lVar4 = lzma_check_is_supported(*(lzma_check *)(*(long *)((long)coder_ptr + 0x50) + 8)),
      lVar4 != '\0')) &&
     (iVar7 = memcmp((void *)(*(long *)((long)coder_ptr + 0x50) + 0x28),
                     (void *)((long)coder_ptr + 0x78),out_size_00), iVar7 != 0)) {
    return LZMA_DATA_ERROR;
  }
  return LZMA_STREAM_END;
}

Assistant:

static lzma_ret
block_decode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_block_coder *coder = coder_ptr;

	switch (coder->sequence) {
	case SEQ_CODE: {
		const size_t in_start = *in_pos;
		const size_t out_start = *out_pos;

		const lzma_ret ret = coder->next.code(coder->next.coder,
				allocator, in, in_pos, in_size,
				out, out_pos, out_size, action);

		const size_t in_used = *in_pos - in_start;
		const size_t out_used = *out_pos - out_start;

		// NOTE: We compare to compressed_limit here, which prevents
		// the total size of the Block growing past LZMA_VLI_MAX.
		if (update_size(&coder->compressed_size, in_used,
					coder->compressed_limit)
				|| update_size(&coder->uncompressed_size,
					out_used,
					coder->block->uncompressed_size))
			return LZMA_DATA_ERROR;

		if (!coder->ignore_check)
			lzma_check_update(&coder->check, coder->block->check,
					out + out_start, out_used);

		if (ret != LZMA_STREAM_END)
			return ret;

		// Compressed and Uncompressed Sizes are now at their final
		// values. Verify that they match the values given to us.
		if (!is_size_valid(coder->compressed_size,
					coder->block->compressed_size)
				|| !is_size_valid(coder->uncompressed_size,
					coder->block->uncompressed_size))
			return LZMA_DATA_ERROR;

		// Copy the values into coder->block. The caller
		// may use this information to construct Index.
		coder->block->compressed_size = coder->compressed_size;
		coder->block->uncompressed_size = coder->uncompressed_size;

		coder->sequence = SEQ_PADDING;
	}

	// Fall through

	case SEQ_PADDING:
		// Compressed Data is padded to a multiple of four bytes.
		while (coder->compressed_size & 3) {
			if (*in_pos >= in_size)
				return LZMA_OK;

			// We use compressed_size here just get the Padding
			// right. The actual Compressed Size was stored to
			// coder->block already, and won't be modified by
			// us anymore.
			++coder->compressed_size;

			if (in[(*in_pos)++] != 0x00)
				return LZMA_DATA_ERROR;
		}

		if (coder->block->check == LZMA_CHECK_NONE)
			return LZMA_STREAM_END;

		if (!coder->ignore_check)
			lzma_check_finish(&coder->check, coder->block->check);

		coder->sequence = SEQ_CHECK;

	// Fall through

	case SEQ_CHECK: {
		const size_t check_size = lzma_check_size(coder->block->check);
		lzma_bufcpy(in, in_pos, in_size, coder->block->raw_check,
				&coder->check_pos, check_size);
		if (coder->check_pos < check_size)
			return LZMA_OK;

		// Validate the Check only if we support it.
		// coder->check.buffer may be uninitialized
		// when the Check ID is not supported.
		if (!coder->ignore_check
				&& lzma_check_is_supported(coder->block->check)
				&& memcmp(coder->block->raw_check,
					coder->check.buffer.u8,
					check_size) != 0)
			return LZMA_DATA_ERROR;

		return LZMA_STREAM_END;
	}
	}

	return LZMA_PROG_ERROR;
}